

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O0

int Ivy_NodeBalanceFindLeft(Vec_Ptr_t *vSuper)

{
  uint uVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  int local_2c;
  int Current;
  Ivy_Obj_t *pObjLeft;
  Ivy_Obj_t *pObjRight;
  Vec_Ptr_t *vSuper_local;
  
  iVar2 = Vec_PtrSize(vSuper);
  if (iVar2 < 3) {
    vSuper_local._4_4_ = 0;
  }
  else {
    local_2c = Vec_PtrSize(vSuper);
    pIVar3 = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,local_2c + -2);
    for (local_2c = local_2c + -3; -1 < local_2c; local_2c = local_2c + -1) {
      pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,local_2c);
      pIVar4 = Ivy_Regular(pIVar4);
      uVar1 = *(uint *)&pIVar4->field_0x8;
      pIVar4 = Ivy_Regular(pIVar3);
      if (uVar1 >> 0xb != *(uint *)&pIVar4->field_0x8 >> 0xb) break;
    }
    vSuper_local._4_4_ = local_2c + 1;
    pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,vSuper_local._4_4_);
    pIVar4 = Ivy_Regular(pIVar4);
    uVar1 = *(uint *)&pIVar4->field_0x8;
    pIVar3 = Ivy_Regular(pIVar3);
    if (uVar1 >> 0xb != *(uint *)&pIVar3->field_0x8 >> 0xb) {
      __assert_fail("Ivy_Regular(pObjLeft)->Level == Ivy_Regular(pObjRight)->Level",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyBalance.c"
                    ,0x13b,"int Ivy_NodeBalanceFindLeft(Vec_Ptr_t *)");
    }
  }
  return vSuper_local._4_4_;
}

Assistant:

int Ivy_NodeBalanceFindLeft( Vec_Ptr_t * vSuper )
{
    Ivy_Obj_t * pObjRight, * pObjLeft;
    int Current;
    // if two or less nodes, pair with the first
    if ( Vec_PtrSize(vSuper) < 3 )
        return 0;
    // set the pointer to the one before the last
    Current = Vec_PtrSize(vSuper) - 2;
    pObjRight = (Ivy_Obj_t *)Vec_PtrEntry( vSuper, Current );
    // go through the nodes to the left of this one
    for ( Current--; Current >= 0; Current-- )
    {
        // get the next node on the left
        pObjLeft = (Ivy_Obj_t *)Vec_PtrEntry( vSuper, Current );
        // if the level of this node is different, quit the loop
        if ( Ivy_Regular(pObjLeft)->Level != Ivy_Regular(pObjRight)->Level )
            break;
    }
    Current++;    
    // get the node, for which the equality holds
    pObjLeft = (Ivy_Obj_t *)Vec_PtrEntry( vSuper, Current );
    assert( Ivy_Regular(pObjLeft)->Level == Ivy_Regular(pObjRight)->Level );
    return Current;
}